

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O3

void fsnav_ins_set_yaw_zero(void)

{
  fsnav_imu *pfVar1;
  
  pfVar1 = fsnav->imu;
  if ((pfVar1 != (fsnav_imu *)0x0) && (0 < fsnav->mode)) {
    (pfVar1->sol).rpy_valid = '\0';
    (pfVar1->sol).L_valid = '\0';
    (pfVar1->sol).rpy[2] = 0.0;
    fsnav_linal_rpy2mat((pfVar1->sol).L,(pfVar1->sol).rpy);
    pfVar1 = fsnav->imu;
    (pfVar1->sol).rpy_valid = '\x01';
    (pfVar1->sol).L_valid = '\x01';
  }
  return;
}

Assistant:

void fsnav_ins_set_yaw_zero(void)
{
	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// операции на каждом шаге
	else {
		// сброс флагов достоверности
		fsnav->imu->sol.rpy_valid = 0;
		fsnav->imu->sol.  L_valid = 0;

		// обнуление угла курса
		fsnav->imu->sol.rpy[2] = 0.0;
		fsnav_linal_rpy2mat(fsnav->imu->sol.L, fsnav->imu->sol.rpy);

		// установка флагов достоверности
		fsnav->imu->sol.rpy_valid = 1;
		fsnav->imu->sol.  L_valid = 1;
	}
}